

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

ssize_t Bcj2_Decode(_7zip *zip,uint8_t *outBuf,size_t outSize)

{
  ulong uVar1;
  byte bVar2;
  uchar uVar3;
  ushort uVar4;
  uchar *puVar5;
  uchar *puVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  uint *puVar12;
  uchar *puVar13;
  size_t sVar14;
  ulong uVar15;
  uint16_t *puVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint *puVar20;
  byte *pbVar21;
  uint uVar22;
  ulong uVar23;
  uint *puVar24;
  long lVar25;
  uint8_t local_6c [4];
  size_t local_68;
  uint *local_60;
  size_t local_58;
  size_t local_50;
  byte *local_48;
  uchar *puStack_40;
  uint8_t out [4];
  
  local_68 = zip->tmp_stream_bytes_remaining;
  puVar5 = zip->tmp_stream_buff;
  sVar14 = zip->tmp_stream_bytes_avail;
  local_50 = zip->sub_stream_bytes_remaining[0];
  puVar13 = zip->sub_stream_buff[0];
  puVar6 = zip->sub_stream_buff[1];
  sVar7 = zip->sub_stream_size[0];
  local_58 = zip->sub_stream_bytes_remaining[1];
  local_48 = zip->sub_stream_buff[2] + zip->sub_stream_size[2];
  sVar8 = zip->sub_stream_bytes_remaining[2];
  pbVar21 = local_48 + -sVar8;
  sVar9 = zip->sub_stream_size[1];
  if (zip->bcj_state == 0) {
    zip->bcj2_prevByte = '\0';
    for (lVar10 = 0; lVar10 != 0x102; lVar10 = lVar10 + 1) {
      zip->bcj2_p[lVar10] = 0x400;
    }
    zip->bcj2_range = 0xffffffff;
    zip->bcj2_code = 0;
    uVar17 = 0;
    for (sVar11 = 0; (int)sVar11 != 5; sVar11 = sVar11 + 1) {
      if (sVar8 == sVar11) {
        return -0x19;
      }
      uVar17 = uVar17 << 8 | (uint)pbVar21[sVar11];
      zip->bcj2_code = uVar17;
    }
    zip->bcj_state = 1;
    pbVar21 = pbVar21 + sVar11;
  }
  lVar10 = sVar14 - local_68;
  puVar24 = (uint *)(puVar13 + (sVar7 - local_50));
  local_60 = (uint *)(puVar6 + (sVar9 - local_58));
  sVar14 = zip->odd_bcj_size;
  for (uVar23 = 0; (sVar14 != 0 && (uVar23 < outSize)); uVar23 = uVar23 + 1) {
    outBuf[uVar23] = zip->odd_bcj[uVar23 & 0xffffffff];
    sVar14 = zip->odd_bcj_size - 1;
    zip->odd_bcj_size = sVar14;
  }
  if (outSize != 0) {
    puStack_40 = zip->odd_bcj;
    lVar25 = 0;
    sVar14 = local_68;
    do {
      uVar15 = outSize - uVar23;
      if (sVar14 - lVar25 <= outSize - uVar23) {
        uVar15 = sVar14 - lVar25;
      }
      if ((zip->bcj_state == 1) && (uVar15 != 0)) {
        while( true ) {
          bVar2 = puVar5[lVar25 + lVar10];
          outBuf[uVar23] = bVar2;
          uVar23 = uVar23 + 1;
          if (((bVar2 & 0xfe) == 0xe8) ||
             (((bVar2 & 0xf0) == 0x80 && (zip->bcj2_prevByte == '\x0f')))) break;
          lVar25 = lVar25 + 1;
          zip->bcj2_prevByte = bVar2;
          uVar15 = uVar15 - 1;
          if (uVar15 == 0) goto LAB_00181eef;
        }
        zip->bcj_state = 2;
        uVar15 = 1;
      }
      if ((uVar23 == outSize) || (uVar15 == 0)) goto LAB_00181eef;
      zip->bcj_state = 1;
      uVar3 = puVar5[lVar25 + lVar10];
      if (uVar3 == 0xe8) {
        puVar16 = zip->bcj2_p + zip->bcj2_prevByte;
      }
      else {
        puVar16 = (uint16_t *)(zip->format_name + (ulong)(uVar3 != 0xe9) * 2 + -0x20);
      }
      uVar4 = *puVar16;
      uVar17 = zip->bcj2_code;
      uVar22 = (zip->bcj2_range >> 0xb) * (uint)uVar4;
      if (uVar17 < uVar22) {
        zip->bcj2_range = uVar22;
        *puVar16 = (short)(0x800 - uVar4 >> 5) + uVar4;
        if (uVar22 < 0x1000000) {
          if (pbVar21 == local_48) {
            return -0x19;
          }
          zip->bcj2_range = uVar22 * 0x100;
          bVar2 = *pbVar21;
          pbVar21 = pbVar21 + 1;
          zip->bcj2_code = (uint)bVar2 | uVar17 << 8;
        }
        zip->bcj2_prevByte = uVar3;
        iVar18 = 0;
      }
      else {
        uVar19 = zip->bcj2_range - uVar22;
        zip->bcj2_range = uVar19;
        zip->bcj2_code = uVar17 - uVar22;
        *puVar16 = uVar4 - (uVar4 >> 5);
        if (uVar19 < 0x1000000) {
          if (pbVar21 != local_48) {
            zip->bcj2_range = uVar19 * 0x100;
            bVar2 = *pbVar21;
            pbVar21 = pbVar21 + 1;
            zip->bcj2_code = (uint)bVar2 | (uVar17 - uVar22) * 0x100;
            goto LAB_00181dd5;
          }
        }
        else {
LAB_00181dd5:
          if (uVar3 == 0xe8) {
            if (3 < local_50) {
              local_50 = local_50 - 4;
              puVar12 = puVar24;
              puVar20 = local_60;
              puVar24 = puVar24 + 1;
LAB_00181e28:
              uVar17 = *puVar12;
              iVar18 = ((uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                        uVar17 << 0x18) - ((int)zip->bcj2_outPos + (int)uVar23)) + -4;
              local_6c[0] = (uint8_t)iVar18;
              local_6c[1] = (char)((uint)iVar18 >> 8);
              local_6c[2] = (char)((uint)iVar18 >> 0x10);
              local_6c[3] = (uint8_t)((uint)iVar18 >> 0x18);
              zip->bcj2_prevByte = local_6c[3];
              for (uVar15 = 0; (uVar1 = uVar15 + uVar23, uVar15 < 4 && (uVar1 < outSize));
                  uVar15 = uVar15 + 1) {
                outBuf[uVar15 + uVar23] = local_6c[uVar15];
              }
              if (uVar15 < 4) {
                zip->odd_bcj_size = 4 - uVar15;
                puVar13 = zip->odd_bcj;
                for (; uVar15 < 4; uVar15 = uVar15 + 1) {
                  *puVar13 = local_6c[uVar15];
                  puVar13 = puVar13 + 1;
                }
                iVar18 = 0xb;
              }
              else {
                iVar18 = 0;
              }
              local_60 = puVar20;
              uVar23 = uVar1;
              goto LAB_00181ece;
            }
          }
          else if (3 < local_58) {
            puVar20 = local_60 + 1;
            local_58 = local_58 - 4;
            puVar12 = local_60;
            goto LAB_00181e28;
          }
        }
        iVar18 = 1;
      }
LAB_00181ece:
      lVar25 = lVar25 + 1;
      sVar14 = local_68;
    } while (iVar18 == 0);
    if (iVar18 != 0xb) {
      return -0x19;
    }
LAB_00181eef:
    zip->tmp_stream_bytes_remaining = zip->tmp_stream_bytes_remaining - lVar25;
    zip->sub_stream_bytes_remaining[0] = local_50;
    zip->sub_stream_bytes_remaining[1] = local_58;
    zip->sub_stream_bytes_remaining[2] = (long)local_48 - (long)pbVar21;
  }
  zip->bcj2_outPos = zip->bcj2_outPos + uVar23;
  return uVar23;
}

Assistant:

static ssize_t
Bcj2_Decode(struct _7zip *zip, uint8_t *outBuf, size_t outSize)
{
	size_t inPos = 0, outPos = 0;
	const uint8_t *buf0, *buf1, *buf2, *buf3;
	size_t size0, size1, size2, size3;
	const uint8_t *buffer, *bufferLim;
	unsigned int i, j;

	size0 = zip->tmp_stream_bytes_remaining;
	buf0 = zip->tmp_stream_buff + zip->tmp_stream_bytes_avail - size0;
	size1 = zip->sub_stream_bytes_remaining[0];
	buf1 = zip->sub_stream_buff[0] + zip->sub_stream_size[0] - size1;
	size2 = zip->sub_stream_bytes_remaining[1];
	buf2 = zip->sub_stream_buff[1] + zip->sub_stream_size[1] - size2;
	size3 = zip->sub_stream_bytes_remaining[2];
	buf3 = zip->sub_stream_buff[2] + zip->sub_stream_size[2] - size3;

	buffer = buf3;
	bufferLim = buffer + size3;

	if (zip->bcj_state == 0) {
		/*
		 * Initialize.
		 */
		zip->bcj2_prevByte = 0;
		for (i = 0;
		    i < sizeof(zip->bcj2_p) / sizeof(zip->bcj2_p[0]); i++)
			zip->bcj2_p[i] = kBitModelTotal >> 1;
		RC_INIT2;
		zip->bcj_state = 1;
	}

	/*
	 * Gather the odd bytes of a previous call.
	 */
	for (i = 0; zip->odd_bcj_size > 0 && outPos < outSize; i++) {
		outBuf[outPos++] = zip->odd_bcj[i];
		zip->odd_bcj_size--;
	}

	if (outSize == 0) {
		zip->bcj2_outPos += outPos;
		return (outPos);
	}

	for (;;) {
		uint8_t b;
		CProb *prob;
		uint32_t bound;
		uint32_t ttt;

		size_t limit = size0 - inPos;
		if (outSize - outPos < limit)
			limit = outSize - outPos;

		if (zip->bcj_state == 1) {
			while (limit != 0) {
				uint8_t bb = buf0[inPos];
				outBuf[outPos++] = bb;
				if (IsJ(zip->bcj2_prevByte, bb)) {
					zip->bcj_state = 2;
					break;
				}
				inPos++;
				zip->bcj2_prevByte = bb;
				limit--;
			}
		}

		if (limit == 0 || outPos == outSize)
			break;
		zip->bcj_state = 1;

		b = buf0[inPos++];

		if (b == 0xE8)
			prob = zip->bcj2_p + zip->bcj2_prevByte;
		else if (b == 0xE9)
			prob = zip->bcj2_p + 256;
		else
			prob = zip->bcj2_p + 257;

		IF_BIT_0(prob) {
			UPDATE_0(prob)
			zip->bcj2_prevByte = b;
		} else {
			uint32_t dest;
			const uint8_t *v;
			uint8_t out[4];

			UPDATE_1(prob)
			if (b == 0xE8) {
				v = buf1;
				if (size1 < 4)
					return SZ_ERROR_DATA;
				buf1 += 4;
				size1 -= 4;
			} else {
				v = buf2;
				if (size2 < 4)
					return SZ_ERROR_DATA;
				buf2 += 4;
				size2 -= 4;
			}
			dest = (((uint32_t)v[0] << 24) |
			    ((uint32_t)v[1] << 16) |
			    ((uint32_t)v[2] << 8) |
			    ((uint32_t)v[3])) -
			    ((uint32_t)zip->bcj2_outPos + (uint32_t)outPos + 4);
			out[0] = (uint8_t)dest;
			out[1] = (uint8_t)(dest >> 8);
			out[2] = (uint8_t)(dest >> 16);
			out[3] = zip->bcj2_prevByte = (uint8_t)(dest >> 24);

			for (i = 0; i < 4 && outPos < outSize; i++)
				outBuf[outPos++] = out[i];
			if (i < 4) {
				/*
				 * Save odd bytes which we could not add into
				 * the output buffer because of out of space.
				 */
				zip->odd_bcj_size = 4 -i;
				for (; i < 4; i++) {
					j = i - 4 + (unsigned)zip->odd_bcj_size;
					zip->odd_bcj[j] = out[i];
				}
				break;
			}
		}
	}